

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O2

void mpc_sbox_prove_s128_256
               (mzd_local_t *out,mzd_local_t *in,view_t *view,rvec_t *rvec,mzd_local_t *mask_a,
               mzd_local_t *mask_b,mzd_local_t *mask_c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  word128 x2m [3] [2];
  word128 r2m [3] [2];
  word128 r1m [3] [2];
  word128 r0m [3] [2];
  word128 r1s [3] [2];
  word128 r0s [3] [2];
  ulong auStack_308 [2];
  ulong auStack_2f8 [10];
  ulong auStack_2a8 [2];
  ulong auStack_298 [10];
  undefined1 auStack_248 [16];
  undefined1 auStack_238 [80];
  ulong auStack_1e8 [2];
  ulong auStack_1d8 [10];
  ulong auStack_188 [2];
  ulong auStack_178 [10];
  undefined1 auStack_128 [16];
  undefined1 auStack_118 [80];
  undefined1 auStack_c8 [16];
  undefined1 auStack_b8 [56];
  word128 x1s [3] [2];
  
  auVar11 = *(undefined1 (*) [16])mask_a->w64;
  auVar12 = *(undefined1 (*) [16])(mask_a->w64 + 2);
  auVar9 = *(undefined1 (*) [16])mask_b->w64;
  auVar10 = *(undefined1 (*) [16])(mask_b->w64 + 2);
  auVar13 = *(undefined1 (*) [16])mask_c->w64;
  auVar14 = *(undefined1 (*) [16])(mask_c->w64 + 2);
  for (lVar5 = 0; lVar5 != 0x60; lVar5 = lVar5 + 0x20) {
    auVar15 = *(undefined1 (*) [16])((long)in->w64 + lVar5);
    auVar17 = *(undefined1 (*) [16])((long)in->w64 + lVar5 + 0x10);
    auVar16 = vandpd_avx(auVar15,auVar11);
    auVar18 = vandpd_avx(auVar15,auVar9);
    auVar15 = vandpd_avx(auVar15,auVar13);
    auVar1 = vandpd_avx(auVar17,auVar12);
    auVar2 = vandpd_avx(auVar17,auVar10);
    *(undefined1 (*) [16])(auStack_248 + lVar5) = auVar15;
    auVar15 = vandpd_avx(auVar17,auVar14);
    auVar17 = vpslldq_avx(auVar16,8);
    auVar17 = vpshldq_avx512_vbmi2(auVar16,auVar17,2);
    *(undefined1 (*) [16])(auStack_238 + lVar5) = auVar15;
    auVar15 = vpsrldq_avx(auVar16,8);
    auVar16 = vpsrlq_avx(auVar15,0x3e);
    *(undefined1 (*) [16])((long)auStack_2a8 + lVar5) = auVar17;
    auVar15 = vpslldq_avx(auVar1,8);
    auVar15 = vpshldq_avx512_vbmi2(auVar1,auVar15,2);
    auVar15 = vpor_avx(auVar15,auVar16);
    auVar17 = vpslldq_avx(auVar18,8);
    auVar17 = vpshldq_avx512_vbmi2(auVar18,auVar17,1);
    *(undefined1 (*) [16])((long)auStack_298 + lVar5) = auVar15;
    auVar15 = vpsrldq_avx(auVar18,8);
    auVar16 = vpsrlq_avx(auVar15,0x3f);
    *(undefined1 (*) [16])((long)auStack_308 + lVar5) = auVar17;
    auVar15 = vpslldq_avx(auVar2,8);
    auVar15 = vpshldq_avx512_vbmi2(auVar2,auVar15,1);
    auVar15 = vpor_avx(auVar15,auVar16);
    *(undefined1 (*) [16])((long)auStack_2f8 + lVar5) = auVar15;
    auVar15 = *(undefined1 (*) [16])((long)rvec + lVar5);
    auVar17 = *(undefined1 (*) [16])((long)rvec + lVar5 + 0x10);
    auVar16 = vandpd_avx(auVar15,auVar11);
    auVar18 = vandpd_avx(auVar15,auVar9);
    auVar15 = vandpd_avx(auVar15,auVar13);
    auVar1 = vandpd_avx(auVar17,auVar12);
    auVar2 = vandpd_avx(auVar17,auVar10);
    *(undefined1 (*) [16])((long)auStack_1e8 + lVar5) = auVar15;
    auVar15 = vandpd_avx(auVar17,auVar14);
    auVar17 = vpslldq_avx(auVar16,8);
    *(undefined1 (*) [16])(auStack_128 + lVar5) = auVar16;
    *(undefined1 (*) [16])((long)auStack_188 + lVar5) = auVar18;
    *(undefined1 (*) [16])(auStack_118 + lVar5) = auVar1;
    *(undefined1 (*) [16])((long)auStack_178 + lVar5) = auVar2;
    auVar17 = vpshldq_avx512_vbmi2(auVar16,auVar17,2);
    *(undefined1 (*) [16])((long)auStack_1d8 + lVar5) = auVar15;
    auVar15 = vpsrldq_avx(auVar16,8);
    auVar16 = vpsrlq_avx(auVar15,0x3e);
    *(undefined1 (*) [16])((long)x1s[0][1] + lVar5 + 8) = auVar17;
    auVar15 = vpslldq_avx(auVar1,8);
    auVar15 = vpshldq_avx512_vbmi2(auVar1,auVar15,2);
    auVar15 = vpor_avx(auVar15,auVar16);
    auVar17 = vpslldq_avx(auVar18,8);
    auVar17 = vpshldq_avx512_vbmi2(auVar18,auVar17,1);
    *(undefined1 (*) [16])((long)x1s[1][0] + lVar5 + 8) = auVar15;
    auVar15 = vpsrldq_avx(auVar18,8);
    auVar16 = vpsrlq_avx(auVar15,0x3f);
    *(undefined1 (*) [16])(auStack_c8 + lVar5) = auVar17;
    auVar15 = vpslldq_avx(auVar2,8);
    auVar15 = vpshldq_avx512_vbmi2(auVar2,auVar15,1);
    auVar15 = vpor_avx(auVar15,auVar16);
    *(undefined1 (*) [16])(auStack_b8 + lVar5) = auVar15;
  }
  lVar5 = 1;
  for (lVar6 = 0; lVar6 != 0x60; lVar6 = lVar6 + 0x20) {
    lVar8 = lVar5;
    if (lVar6 == 0x40) {
      lVar8 = 0;
    }
    lVar5 = lVar5 + 1;
    auVar9 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_2a8 + lVar8 * 4),
                                 *(undefined1 (*) [16])((long)auStack_2a8 + lVar6),
                                 *(undefined1 (*) [16])((long)auStack_308 + lVar6),0x28);
    auVar11 = vpand_avx(*(undefined1 (*) [16])((long)auStack_2a8 + lVar6),
                        *(undefined1 (*) [16])(auStack_308 + lVar8 * 4));
    auVar10 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_298 + lVar8 * 4),
                                  *(undefined1 (*) [16])((long)auStack_298 + lVar6),
                                  *(undefined1 (*) [16])((long)auStack_2f8 + lVar6),0x28);
    auVar12 = vpand_avx(*(undefined1 (*) [16])((long)auStack_298 + lVar6),
                        *(undefined1 (*) [16])(auStack_2f8 + lVar8 * 4));
    auVar9 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)auStack_1e8 + lVar6) ^
                                 *(undefined1 (*) [16])(auStack_1e8 + lVar8 * 4),auVar11,auVar9,0x96
                                );
    auVar11 = *(undefined1 (*) [16])(auStack_1d8 + lVar8 * 4);
    *(undefined1 (*) [16])(auStack_128 + lVar6) = auVar9;
    auVar11 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)auStack_1d8 + lVar6) ^ auVar11,
                                  auVar12,auVar10,0x96);
    *(undefined1 (*) [16])(auStack_118 + lVar6) = auVar11;
    *(undefined1 (*) [16])((long)view + lVar6) = auVar9;
    *(undefined1 (*) [16])((long)view + lVar6 + 0x10) = auVar11;
  }
  lVar5 = 1;
  for (lVar6 = 0; lVar6 != 0x60; lVar6 = lVar6 + 0x20) {
    lVar8 = lVar5;
    if (lVar6 == 0x40) {
      lVar8 = 0;
    }
    lVar5 = lVar5 + 1;
    lVar7 = lVar8 * 0x20;
    auVar9 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_308 + lVar8 * 4),
                                 *(undefined1 (*) [16])((long)auStack_308 + lVar6),
                                 *(undefined1 (*) [16])(auStack_248 + lVar6),0x28);
    auVar11 = vpand_avx(*(undefined1 (*) [16])((long)auStack_308 + lVar6),
                        *(undefined1 (*) [16])(auStack_248 + lVar7));
    auVar10 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_2f8 + lVar8 * 4),
                                  *(undefined1 (*) [16])((long)auStack_2f8 + lVar6),
                                  *(undefined1 (*) [16])(auStack_238 + lVar6),0x28);
    auVar12 = vpand_avx(*(undefined1 (*) [16])((long)auStack_2f8 + lVar6),
                        *(undefined1 (*) [16])(auStack_238 + lVar7));
    auVar9 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_c8 + lVar6) ^
                                 *(undefined1 (*) [16])(auStack_c8 + lVar7),auVar11,auVar9,0x96);
    auVar11 = *(undefined1 (*) [16])(x1s[lVar8 + -2][0] + 1);
    auVar13 = vpsrldq_avx(auVar9,8);
    *(undefined1 (*) [16])((long)auStack_1e8 + lVar6) = auVar9;
    auVar9 = vpshldq_avx512_vbmi2(auVar13,auVar9,0x3f);
    auVar11 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_b8 + lVar6) ^ auVar11,auVar12,
                                  auVar10,0x96);
    auVar12 = vpslldq_avx(auVar11,8);
    *(undefined1 (*) [16])((long)auStack_1d8 + lVar6) = auVar11;
    auVar10 = vpsrldq_avx(auVar11,8);
    auVar12 = vpsllq_avx(auVar12,0x3f);
    auVar11 = vpshldq_avx512_vbmi2(auVar10,auVar11,0x3f);
    auVar12 = vpternlogq_avx512vl(auVar9,auVar12,*(undefined1 (*) [16])((long)view + lVar6),0x56);
    *(undefined1 (*) [16])((long)view + lVar6) = auVar12;
    *(undefined1 (*) [16])((long)view + lVar6 + 0x10) =
         auVar11 ^ *(undefined1 (*) [16])((long)view + lVar6 + 0x10);
  }
  lVar5 = 1;
  for (lVar6 = 0; lVar6 != 0x60; lVar6 = lVar6 + 0x20) {
    auVar11 = *(undefined1 (*) [16])((long)x1s[1][0] + lVar6 + 8);
    lVar8 = lVar5;
    if (lVar6 == 0x40) {
      lVar8 = 0;
    }
    lVar5 = lVar5 + 1;
    auVar10 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_2a8 + lVar8 * 4),
                                  *(undefined1 (*) [16])((long)auStack_2a8 + lVar6),
                                  *(undefined1 (*) [16])(auStack_248 + lVar6),0x28);
    auVar12 = vpand_avx(*(undefined1 (*) [16])((long)auStack_2a8 + lVar6),
                        *(undefined1 (*) [16])(auStack_248 + lVar8 * 0x20));
    auVar13 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_298 + lVar8 * 4),
                                  *(undefined1 (*) [16])((long)auStack_298 + lVar6),
                                  *(undefined1 (*) [16])(auStack_238 + lVar6),0x28);
    auVar9 = vpand_avx(*(undefined1 (*) [16])((long)auStack_298 + lVar6),
                       *(undefined1 (*) [16])(auStack_238 + lVar8 * 0x20));
    auVar10 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)x1s[0][1] + lVar6 + 8) ^
                                  *(undefined1 (*) [16])(x1s[lVar8][1] + 1),auVar12,auVar10,0x96);
    auVar12 = *(undefined1 (*) [16])(x1s[lVar8 + 1][0] + 1);
    auVar14 = vpsrldq_avx(auVar10,8);
    *(undefined1 (*) [16])((long)auStack_188 + lVar6) = auVar10;
    auVar10 = vpshldq_avx512_vbmi2(auVar14,auVar10,0x3e);
    auVar11 = vpternlogq_avx512vl(auVar11 ^ auVar12,auVar9,auVar13,0x96);
    auVar12 = vpslldq_avx(auVar11,8);
    *(undefined1 (*) [16])((long)auStack_178 + lVar6) = auVar11;
    auVar9 = vpsrldq_avx(auVar11,8);
    auVar12 = vpsllq_avx(auVar12,0x3e);
    auVar11 = vpshldq_avx512_vbmi2(auVar9,auVar11,0x3e);
    auVar12 = vpternlogq_avx512vl(auVar10,auVar12,*(undefined1 (*) [16])((long)view + lVar6),0x56);
    *(undefined1 (*) [16])((long)view + lVar6) = auVar12;
    *(undefined1 (*) [16])((long)view + lVar6 + 0x10) =
         auVar11 ^ *(undefined1 (*) [16])((long)view + lVar6 + 0x10);
  }
  for (lVar5 = 0; lVar5 != 0x60; lVar5 = lVar5 + 0x20) {
    uVar3 = *(ulong *)((long)auStack_2a8 + lVar5 + 8);
    uVar4 = *(ulong *)((long)auStack_298 + lVar5 + 8);
    auVar11._0_8_ = *(ulong *)((long)auStack_2a8 + lVar5) ^ *(ulong *)((long)auStack_1e8 + lVar5);
    auVar11._8_8_ = uVar3 ^ *(ulong *)((long)auStack_1e8 + lVar5 + 8);
    auVar13._0_8_ = *(ulong *)((long)auStack_2a8 + lVar5) ^ *(ulong *)((long)auStack_308 + lVar5);
    auVar13._8_8_ = uVar3 ^ *(ulong *)((long)auStack_308 + lVar5 + 8);
    auVar10._0_8_ = auVar13._0_8_ ^ *(ulong *)((long)auStack_188 + lVar5);
    auVar10._8_8_ = auVar13._8_8_ ^ *(ulong *)((long)auStack_188 + lVar5 + 8);
    *(undefined1 (*) [16])((long)auStack_1e8 + lVar5) = auVar11;
    auVar12 = vpsrldq_avx(auVar11,8);
    auVar9._0_8_ = *(ulong *)((long)auStack_298 + lVar5) ^ *(ulong *)((long)auStack_1d8 + lVar5);
    auVar9._8_8_ = uVar4 ^ *(ulong *)((long)auStack_1d8 + lVar5 + 8);
    auVar14._0_8_ = *(ulong *)((long)auStack_298 + lVar5) ^ *(ulong *)((long)auStack_2f8 + lVar5);
    auVar14._8_8_ = uVar4 ^ *(ulong *)((long)auStack_2f8 + lVar5 + 8);
    *(undefined1 (*) [16])((long)auStack_188 + lVar5) = auVar10;
    auVar17 = vpsrldq_avx(auVar10,8);
    auVar12 = vpshldq_avx512_vbmi2(auVar12,auVar11,0x3e);
    auVar15._0_8_ = auVar14._0_8_ ^ *(ulong *)((long)auStack_178 + lVar5);
    auVar15._8_8_ = auVar14._8_8_ ^ *(ulong *)((long)auStack_178 + lVar5 + 8);
    auVar11 = vpshldq_avx512_vbmi2(auVar17,auVar10,0x3f);
    auVar17 = vpsrldq_avx(auVar9,8);
    auVar10 = vpslldq_avx(auVar9,8);
    *(undefined1 (*) [16])((long)auStack_1d8 + lVar5) = auVar9;
    auVar9 = vpshldq_avx512_vbmi2(auVar17,auVar9,0x3e);
    auVar16 = vpslldq_avx(auVar15,8);
    auVar18 = vpsrldq_avx(auVar15,8);
    *(undefined1 (*) [16])((long)auStack_178 + lVar5) = auVar15;
    auVar17 = vpsllq_avx(auVar10,0x3e);
    auVar10 = vpshldq_avx512_vbmi2(auVar18,auVar15,0x3f);
    auVar15 = vpsllq_avx(auVar16,0x3f);
    auVar11 = vpor_avx(auVar15,auVar11);
    auVar12 = vpternlogq_avx512vl(auVar12,auVar11,auVar17,0x36);
    *(undefined1 (*) [16])((long)auStack_2f8 + lVar5) = auVar10;
    *(undefined1 (*) [16])((long)auStack_308 + lVar5) = auVar11;
    *(undefined1 (*) [16])((long)auStack_2a8 + lVar5) = auVar12;
    auVar11 = vpternlogq_avx512vl(auVar12,*(undefined1 (*) [16])(auStack_128 + lVar5) ^
                                          *(undefined1 (*) [16])(auStack_248 + lVar5),auVar13,0x96);
    auVar12 = vpternlogq_avx512vl(*(undefined1 (*) [16])(auStack_118 + lVar5) ^
                                  *(undefined1 (*) [16])(auStack_238 + lVar5),auVar10 ^ auVar9,
                                  auVar14,0x96);
    *(undefined1 (*) [16])((long)auStack_298 + lVar5) = auVar10 ^ auVar9;
    *(undefined1 (*) [16])(auStack_128 + lVar5) = auVar11;
    *(undefined1 (*) [16])(auStack_118 + lVar5) = auVar12;
    *(undefined1 (*) [16])((long)out->w64 + lVar5) = auVar11;
    *(undefined1 (*) [16])((long)out->w64 + lVar5 + 0x10) = auVar12;
  }
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void mpc_sbox_prove_s128_256(mzd_local_t* out, const mzd_local_t* in, view_t* view,
                                           const rvec_t* rvec, const mzd_local_t* mask_a,
                                           const mzd_local_t* mask_b, const mzd_local_t* mask_c) {
  bitsliced_mm128_256_step_1(SC_PROOF, mask_a, mask_b, mask_c);

  // a & b
  mpc_mm128_256_and_def(NROLR, r0m, x0s, x1s, r2m, 0);
  // b & c
  mpc_mm128_256_and_def(mm128_shift_right_256, r2m, x1s, x2m, r1s, 1);
  // c & a
  mpc_mm128_256_and_def(mm128_shift_right_256, r1m, x0s, x2m, r0s, 2);

  bitsliced_mm128_256_step_2(SC_PROOF);
}